

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O1

int ffprwu(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  int iVar1;
  int typecode;
  LONGLONG repeat;
  int nullstatus;
  int ncols;
  LONGLONG width;
  LONGLONG ntotrows;
  int local_54;
  LONGLONG local_50;
  int local_48;
  int local_44;
  LONGLONG local_40;
  long local_38;
  
  local_54 = 0;
  local_50 = 0;
  local_40 = 0;
  iVar1 = *status;
  if (iVar1 < 1) {
    if ((0 < firstrow && 0 < nrows) &&
       (ffgnrwll(fptr,&local_38,status), firstrow + nrows + -1 <= local_38)) {
      ffgncl(fptr,&local_44,status);
      if (*status != 0) {
        return *status;
      }
      if (0 < local_44) {
        iVar1 = 0;
        do {
          iVar1 = iVar1 + 1;
          local_50 = 0;
          local_54 = 0;
          local_40 = 0;
          ffgtclll(fptr,iVar1,&local_54,&local_50,&local_40,status);
          if (*status != 0) break;
          if (local_54 == 0x10) {
            local_50 = local_50 / local_40;
          }
          local_48 = 0;
          ffpclu(fptr,iVar1,firstrow,1,local_50 * nrows,&local_48);
          if ((local_48 != 0) && (local_48 != 0x13a)) {
            *status = local_48;
            return local_48;
          }
        } while (iVar1 < local_44);
      }
      return *status;
    }
    *status = 0x133;
    iVar1 = 0x133;
  }
  return iVar1;
}

Assistant:

int ffprwu(fitsfile *fptr,
           LONGLONG firstrow,
           LONGLONG nrows, 
           int *status)

/* 
 * fits_write_nullrows / ffprwu - write TNULLs to all columns in one or more rows
 *
 * fitsfile *fptr - pointer to FITS HDU opened for read/write
 * long int firstrow - first table row to set to null. (firstrow >= 1)
 * long int nrows - total number or rows to set to null. (nrows >= 1)
 * int *status - upon return, *status contains CFITSIO status code
 *
 * RETURNS: CFITSIO status code
 *
 * written by Craig Markwardt, GSFC 
 */
{
  LONGLONG ntotrows;
  int ncols, i;
  int typecode = 0;
  LONGLONG repeat = 0, width = 0;
  int nullstatus;

  if (*status > 0) return *status;

  if ((firstrow <= 0) || (nrows <= 0)) return (*status = BAD_ROW_NUM);

  fits_get_num_rowsll(fptr, &ntotrows, status);

  if (firstrow + nrows - 1 > ntotrows) return (*status = BAD_ROW_NUM);
  
  fits_get_num_cols(fptr, &ncols, status);
  if (*status) return *status;


  /* Loop through each column and write nulls */
  for (i=1; i <= ncols; i++) {
    repeat = 0;  typecode = 0;  width = 0;
    fits_get_coltypell(fptr, i, &typecode, &repeat, &width, status);
    if (*status) break;

    /* NOTE: data of TSTRING type must not write the total repeat
       count, since the repeat count is the *character* count, not the
       nstring count.  Divide by string width to get number of
       strings. */
    
    if (typecode == TSTRING) repeat /= width;

    /* Write NULLs */
    nullstatus = 0;
    fits_write_col_null(fptr, i, firstrow, 1, repeat*nrows, &nullstatus);

    /* ignore error if no null value is defined for the column */
    if (nullstatus && nullstatus != NO_NULL) return (*status = nullstatus);
    
  }
    
  return *status;
}